

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

void __thiscall
duckdb::CopyToFunctionGlobalState::~CopyToFunctionGlobalState(CopyToFunctionGlobalState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::GlobalFunctionData_*,_false> _Var1;
  
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__CopyToFunctionGlobalState_01996930;
  ::std::
  _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->previous_partitions)._M_h);
  ::std::
  _Hashtable<duckdb::vector<duckdb::Value,_true>,_std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>,_std::allocator<std::pair<const_duckdb::vector<duckdb::Value,_true>,_duckdb::unique_ptr<duckdb::PartitionWriteInfo,_std::default_delete<duckdb::PartitionWriteInfo>,_true>_>_>,_std::__detail::_Select1st,_duckdb::VectorOfValuesEquality,_duckdb::VectorOfValuesHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->active_partitioned_writes)._M_h);
  ::std::unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_>::~unique_ptr
            (&(this->file_write_lock_if_rotating).
              super_unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_>);
  ::std::
  vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>_>_>
  ::~vector(&(this->written_files).
             super_vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>_>_>
           );
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->partition_state).internal.
            super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->created_directories)._M_h);
  _Var1._M_head_impl =
       (this->global_state).
       super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
       .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (GlobalFunctionData *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_GlobalFunctionData[1])();
  }
  (this->global_state).
  super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       (GlobalFunctionData *)0x0;
  StorageLock::~StorageLock(&this->lock);
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  operator_delete(this);
  return;
}

Assistant:

explicit CopyToFunctionGlobalState(ClientContext &context)
	    : initialized(false), rows_copied(0), last_file_offset(0),
	      file_write_lock_if_rotating(make_uniq<StorageLock>()) {
		max_open_files = ClientConfig::GetConfig(context).partitioned_write_max_open_files;
	}